

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void notch::core::internal::emul<float*,float*,float*>
               (float *x_begin,float *x_end,float *y_begin,float *y_end,float *z_begin,float *z_end)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  invalid_argument *this;
  float *z_i;
  float y_i;
  float x_i;
  OMP_size_t i;
  string local_1f8 [48];
  ostringstream local_1c8 [8];
  ostringstream what;
  size_t z_size;
  size_t y_size;
  size_t x_size;
  float *z_end_local;
  float *z_begin_local;
  float *y_end_local;
  float *y_begin_local;
  float *x_end_local;
  float *x_begin_local;
  
  uVar1 = ::std::distance<float*>(x_begin,x_end);
  uVar2 = ::std::distance<float*>(y_begin,y_end);
  uVar3 = ::std::distance<float*>(z_begin,z_end);
  if ((uVar1 == uVar2) && (uVar1 == uVar3)) {
    for (_y_i = 0; _y_i < uVar1; _y_i = _y_i + 1) {
      z_begin[_y_i] = x_begin[_y_i] * y_begin[_y_i];
    }
    return;
  }
  ::std::__cxx11::ostringstream::ostringstream(local_1c8);
  poVar4 = ::std::operator<<((ostream *)local_1c8,"stl_emul: vector sizes don\'t match:\n");
  poVar4 = ::std::operator<<(poVar4," x size = ");
  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,uVar1);
  poVar4 = ::std::operator<<(poVar4," y size = ");
  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,uVar2);
  poVar4 = ::std::operator<<(poVar4," z size = ");
  ::std::ostream::operator<<(poVar4,uVar3);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::ostringstream::str();
  ::std::invalid_argument::invalid_argument(this,local_1f8);
  __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

void
INTERNAL_NOBLAS(emul)(
     VectorX_Iter x_begin, VectorX_Iter x_end,
     VectorY_Iter y_begin, VectorY_Iter y_end,
     VectorZ_OutIter z_begin, VectorZ_OutIter z_end) {
    size_t x_size = std::distance(x_begin, x_end);
    size_t y_size = std::distance(y_begin, y_end);
    size_t z_size = std::distance(z_begin, z_end);
    if (x_size != y_size || x_size != z_size) {
        std::ostringstream what;
        what << "stl_emul: vector sizes don't match:\n"
            << " x size = " << x_size
            << " y size = " << y_size
            << " z size = " << z_size;
        throw std::invalid_argument(what.str());
    }
#ifdef NOTCH_USE_OPENMP
#pragma omp parallel for shared(x_begin, y_begin, z_begin, x_size)
#endif
    for (OMP_size_t i = 0; i < x_size; ++i) {
        float x_i = *(x_begin + i);
        float y_i = *(y_begin + i);
        float &z_i = *(z_begin + i);
        z_i = x_i * y_i;
    }
}